

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

reference __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
::GrowAndEmplaceBack<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>
          (InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
           *this,QueueEntry *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  uint64 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  QueueEntry *pQVar6;
  Rep *pRVar7;
  ulong uVar8;
  long lVar9;
  Allocation new_allocation;
  
  uVar2 = (this->allocator_and_tag_).tag_.size_;
  uVar8 = uVar2 >> 1;
  uVar5 = 0x10;
  if ((uVar2 & 1) != 0) {
    uVar5 = *(ulong *)&this->rep_;
  }
  if (uVar8 == uVar5) {
    pQVar6 = __gnu_cxx::new_allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>::allocate
                       ((new_allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry> *)this,
                        uVar2 & 0xfffffffffffffffe,(void *)0x0);
    pQVar6[uVar8].index_cell = args->index_cell;
    uVar3 = (args->id).id_;
    pQVar6[uVar8].distance.distance_.length2_ = (args->distance).distance_.length2_;
    pQVar6[uVar8].id.id_ = uVar3;
    if (((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
      pRVar7 = &this->rep_;
    }
    else {
      pRVar7 = *(Rep **)((long)&this->rep_ + 8);
    }
    if (1 < uVar2) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)&pQVar6->index_cell + lVar9) =
             *(undefined8 *)((long)pRVar7 + lVar9 + 0x10);
        uVar4 = ((undefined8 *)((long)pRVar7 + lVar9))[1];
        puVar1 = (undefined8 *)((long)&(pQVar6->distance).distance_.length2_ + lVar9);
        *puVar1 = *(undefined8 *)((long)pRVar7 + lVar9);
        puVar1[1] = uVar4;
        lVar9 = lVar9 + 0x18;
      } while (uVar8 * 0x18 != lVar9);
    }
    new_allocation.buffer_ = pQVar6;
    new_allocation.capacity_ = uVar2 & 0xfffffffffffffffe;
    ResetAllocation(this,new_allocation,uVar8 + 1);
    return pQVar6 + uVar8;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, 16>::GrowAndEmplaceBack(Args &&...) [T = S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }